

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

bool __thiscall google::protobuf::io::CodedOutputStream::HadError(CodedOutputStream *this)

{
  string *psVar1;
  undefined8 *puVar2;
  size_type *psVar3;
  size_type *psVar4;
  size_type sVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint8_t *puVar8;
  size_type __n;
  long lVar9;
  FileInfo *pFVar10;
  _Alloc_hider *p_Var11;
  size_type *psVar12;
  size_type *psVar13;
  long lVar14;
  undefined8 *puVar15;
  long *extraout_RDX;
  char *pcVar16;
  size_type *psVar17;
  new_allocator<google::protobuf::compiler::ZipWriter::FileInfo> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  FileInfo *pFVar19;
  
  this_00 = (new_allocator<google::protobuf::compiler::ZipWriter::FileInfo> *)
            &stack0xffffffffffffffe8;
  psVar17 = (size_type *)this->cur_;
  puVar8 = (uint8_t *)google::protobuf::io::EpsCopyOutputStream::FlushAndResetBuffer((uchar *)this);
  this->cur_ = puVar8;
  if (puVar8 == (uint8_t *)0x0) {
    HadError((CodedOutputStream *)&stack0xffffffffffffffe8);
    __n = std::
          vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
          ::_M_check_len((vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                          *)this_00,1,"vector::_M_realloc_insert");
    psVar3 = *(size_type **)this_00;
    psVar4 = *(size_type **)(this_00 + 8);
    lVar9 = (long)psVar17 - (long)psVar3 >> 4;
    if (__n == 0) {
      pFVar10 = (FileInfo *)0x0;
    }
    else {
      pFVar10 = __gnu_cxx::new_allocator<google::protobuf::compiler::ZipWriter::FileInfo>::allocate
                          (this_00,__n,(void *)0x0);
    }
    psVar1 = (string *)(&(pFVar10->name)._M_dataplus + lVar9 * 2);
    p_Var11 = &(pFVar10->name)._M_dataplus + lVar9 * 2;
    p_Var11->_M_p = (pointer)(p_Var11 + 2);
    std::__cxx11::string::_M_construct<char*>(psVar1,*extraout_RDX,extraout_RDX[1] + *extraout_RDX);
    *(int *)(psVar1 + 0x28) = (int)extraout_RDX[5];
    *(long *)(psVar1 + 0x20) = extraout_RDX[4];
    pFVar19 = pFVar10;
    if (psVar3 != psVar17) {
      psVar12 = psVar3 + 2;
      paVar7 = &(pFVar10->name).field_2;
      do {
        paVar18 = paVar7;
        (((string *)(paVar18 + -1))->_M_dataplus)._M_p = (pointer)paVar18;
        if (psVar12 == (size_type *)psVar12[-2]) {
          sVar5 = psVar12[1];
          paVar18->_M_allocated_capacity = *psVar12;
          *(size_type *)((long)paVar18 + 8) = sVar5;
        }
        else {
          (((string *)(paVar18 + -1))->_M_dataplus)._M_p = (pointer)psVar12[-2];
          paVar18->_M_allocated_capacity = *psVar12;
        }
        *(size_type *)((long)paVar18 + -8) = psVar12[-1];
        psVar12[-2] = (size_type)psVar12;
        psVar12[-1] = 0;
        *(undefined1 *)psVar12 = 0;
        *(int *)((long)paVar18 + 0x18) = (int)psVar12[3];
        paVar18[1]._M_allocated_capacity = psVar12[2];
        psVar13 = psVar12 + 4;
        psVar12 = psVar12 + 6;
        paVar7 = paVar18 + 3;
      } while (psVar13 != psVar17);
      pFVar19 = (FileInfo *)(paVar18 + 2);
    }
    if (psVar4 != psVar17) {
      lVar9 = 0;
      do {
        lVar14 = lVar9;
        pcVar16 = pFVar19[1].name.field_2._M_local_buf + lVar14;
        *(char **)((long)&pFVar19[1].name._M_dataplus._M_p + lVar14) = pcVar16;
        puVar2 = (undefined8 *)(lVar14 + (long)psVar17);
        puVar15 = puVar2 + 2;
        if (puVar15 == (undefined8 *)*puVar2) {
          uVar6 = puVar2[3];
          *(undefined8 *)pcVar16 = *puVar15;
          *(undefined8 *)((long)&pFVar19[1].name.field_2 + lVar14 + 8) = uVar6;
        }
        else {
          *(undefined8 **)((long)&pFVar19[1].name._M_dataplus._M_p + lVar14) = (undefined8 *)*puVar2
          ;
          *(undefined8 *)((long)&pFVar19[1].name.field_2 + lVar14) = *puVar15;
        }
        puVar2 = (undefined8 *)(lVar14 + (long)psVar17);
        *(undefined8 *)((long)&pFVar19[1].name._M_string_length + lVar14) = puVar2[1];
        *puVar2 = puVar15;
        puVar2[1] = 0;
        *(undefined1 *)(puVar2 + 2) = 0;
        *(undefined4 *)((long)&pFVar19[1].crc32 + lVar14) = *(undefined4 *)(puVar2 + 5);
        *(undefined8 *)((long)&pFVar19[1].offset + lVar14) = puVar2[4];
        lVar9 = lVar14 + 0x30;
      } while (puVar2 + 6 != psVar4);
      pFVar19 = (FileInfo *)((long)&pFVar19[1].name._M_dataplus._M_p + lVar14);
    }
    if (psVar3 != (size_type *)0x0) {
      operator_delete(psVar3,*(long *)(this_00 + 0x10) - (long)psVar3);
    }
    *(FileInfo **)this_00 = pFVar10;
    *(FileInfo **)(this_00 + 8) = pFVar19 + 1;
    *(FileInfo **)(this_00 + 0x10) = pFVar10 + __n;
    return SUB81(pFVar10 + __n,0);
  }
  return (this->impl_).had_error_;
}

Assistant:

bool HadError() {
    cur_ = impl_.FlushAndResetBuffer(cur_);
    ABSL_DCHECK(cur_);
    return impl_.HadError();
  }